

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int ret;
  int is_nonce_valid;
  int overflow;
  secp256k1_scalar non;
  secp256k1_ge r;
  uchar nonce32 [32];
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  secp256k1_scalar n;
  uchar b [32];
  uint local_260;
  uint local_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  uint local_238;
  uint local_234;
  int local_230;
  uint local_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  secp256k1_ecdsa_signature *local_208;
  secp256k1_context *local_200;
  uchar *local_1f8;
  secp256k1_nonce_function local_1f0;
  uchar *local_1e8;
  void *local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  secp256k1_scalar local_158;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  uchar local_d8 [32];
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uchar local_58 [40];
  
  local_1e0 = noncedata;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_ecdsa_sign_cold_4();
  }
  else if (msghash32 == (uchar *)0x0) {
    secp256k1_ecdsa_sign_cold_3();
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_sign_cold_2();
  }
  else {
    if (seckey != (uchar *)0x0) {
      local_260 = 0;
      local_228 = (undefined1  [16])0x0;
      local_218 = (undefined1  [16])0x0;
      local_258 = (undefined1  [16])0x0;
      local_248 = (undefined1  [16])0x0;
      local_1f0 = nonce_function_rfc6979;
      if (noncefp != (secp256k1_nonce_function)0x0) {
        local_1f0 = noncefp;
      }
      local_208 = signature;
      local_1e8 = seckey;
      secp256k1_scalar_set_b32(&local_98,seckey,(int *)local_1d8);
      local_238 = (uint)(((local_98.d[2] != 0 || local_98.d[3] != 0) ||
                         (local_98.d[1] != 0 || local_98.d[0] != 0)) && local_1d8._0_4_ == 0);
      uVar10 = local_238 ^ 1;
      local_1d8._0_4_ = uVar10;
      uVar1 = (long)(int)uVar10 - 1;
      local_98.d[1] = local_98.d[1] & uVar1;
      local_98.d[0] = (ulong)uVar10 | local_98.d[0] & uVar1;
      local_98.d[3] = uVar1 & local_98.d[3];
      local_98.d[2] = local_98.d[2] & uVar1;
      local_1f8 = msghash32;
      secp256k1_scalar_set_b32(&local_b8,msghash32,(int *)0x0);
      uVar10 = 0;
      local_200 = ctx;
      do {
        bVar8 = false;
        iVar11 = (*local_1f0)(local_d8,local_1f8,local_1e8,(uchar *)0x0,local_1e0,uVar10);
        local_260 = (uint)(iVar11 != 0);
        if (iVar11 != 0) {
          secp256k1_scalar_set_b32(&local_158,local_d8,(int *)local_1d8);
          local_25c = (uint)(((local_158.d[3] != 0 || local_158.d[1] != 0) ||
                             (local_158.d[2] != 0 || local_158.d[0] != 0)) && local_1d8._0_4_ == 0);
          if (ctx->declassify != 0) {
            local_1d8._8_8_ = &local_25c;
            local_1d8._0_8_ = 0x4d430002;
            local_1c8 = ZEXT816(4);
            local_1b8 = ZEXT816(0);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_138._8_8_;
            local_138 = auVar9 << 0x40;
          }
          if (local_25c != 0) {
            lVar14 = 0;
            local_230 = 0;
            local_234 = uVar10;
            secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)local_1d8,&local_158);
            secp256k1_ge_set_gej((secp256k1_ge *)local_138,(secp256k1_gej *)local_1d8);
            secp256k1_fe_impl_normalize((secp256k1_fe *)local_138);
            secp256k1_fe_impl_normalize((secp256k1_fe *)(local_118 + 8));
            secp256k1_fe_impl_get_b32(local_58,(secp256k1_fe *)local_138);
            secp256k1_scalar_set_b32((secp256k1_scalar *)local_228,local_58,&local_230);
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)local_78,(secp256k1_scalar *)local_228,&local_98);
            secp256k1_scalar_add
                      ((secp256k1_scalar *)local_78,(secp256k1_scalar *)local_78,&local_b8);
            secp256k1_scalar_inverse((secp256k1_scalar *)local_258,&local_158);
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)local_258,(secp256k1_scalar *)local_258,
                       (secp256k1_scalar *)local_78);
            local_68 = (undefined1  [16])0x0;
            local_78 = (undefined1  [16])0x0;
            local_168 = (undefined1  [16])0x0;
            local_178 = (undefined1  [16])0x0;
            local_188 = (undefined1  [16])0x0;
            local_198 = (undefined1  [16])0x0;
            local_1a8 = (undefined1  [16])0x0;
            local_1b8 = (undefined1  [16])0x0;
            local_1c8 = (undefined1  [16])0x0;
            local_1d8 = (undefined1  [16])0x0;
            local_e8._0_4_ = 0;
            local_e8._4_4_ = 0;
            local_f8 = (undefined1  [16])0x0;
            local_108 = (undefined1  [16])0x0;
            local_118 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            local_138 = (undefined1  [16])0x0;
            uVar15 = local_248._12_4_ >> 0x1f;
            uVar10 = uVar15 ^ 1;
            uVar16 = uVar10;
            if (local_248._0_8_ == 0xffffffffffffffff) {
              uVar16 = 0;
            }
            if (0x5d576e7357a4501c < (ulong)local_258._8_8_) {
              uVar10 = 0;
            }
            uVar10 = (uVar10 | uVar16 | (ulong)local_248._8_8_ < 0x7fffffffffffffff) ^ 1;
            local_22c = 0;
            if (0xdfe92f46681b20a0 < (ulong)local_258._0_8_) {
              local_22c = uVar10;
            }
            if (0x5d576e7357a4501d < (ulong)local_258._8_8_) {
              local_22c = uVar10;
            }
            local_22c = local_22c | uVar15;
            uVar13 = -(long)(int)local_22c;
            uVar1 = (ulong)CARRY8(uVar13 & 0xbfd25e8cd0364142,local_258._0_8_ ^ uVar13);
            uVar3 = (uVar13 & 0xbaaedce6af48a03b) + (local_258._8_8_ ^ uVar13);
            uVar2 = (ulong)(CARRY8(uVar13 & 0xbaaedce6af48a03b,local_258._8_8_ ^ uVar13) ||
                           CARRY8(uVar3,uVar1));
            uVar4 = (uVar13 & 0xfffffffffffffffe) + (local_248._0_8_ ^ uVar13);
            lVar12 = ((local_248._8_8_ ^ uVar13) - (long)(int)local_22c) +
                     (ulong)(CARRY8(uVar13 & 0xfffffffffffffffe,local_248._0_8_ ^ uVar13) ||
                            CARRY8(uVar4,uVar2));
            lVar5 = uVar4 + uVar2;
            lVar6 = (uVar13 & 0xbfd25e8cd0364142) + (local_258._0_8_ ^ uVar13);
            lVar7 = uVar3 + uVar1;
            if (((local_248._0_8_ == 0 && local_248._8_8_ == 0) && local_258._8_8_ == 0) &&
                local_258._0_8_ == 0) {
              lVar12 = lVar14;
              lVar5 = lVar14;
              lVar6 = lVar14;
              lVar7 = lVar14;
            }
            local_258._8_8_ = lVar7;
            local_258._0_8_ = lVar6;
            local_248._8_8_ = lVar12;
            local_248._0_8_ = lVar5;
            local_260 = (uint)((((lVar7 != 0 || lVar6 != 0) || lVar5 != 0) || lVar12 != 0) &&
                              ((local_228._8_8_ != 0 || local_218._8_8_ != 0) ||
                              (local_228._0_8_ != 0 || local_218._0_8_ != 0)));
            if (local_200->declassify != 0) {
              local_1d8._8_8_ = &local_260;
              local_1d8._0_8_ = 0x4d430002;
              local_1c8 = ZEXT816(4);
              local_1b8 = ZEXT816(0);
              local_138 = ZEXT816(0) << 0x40;
            }
            ctx = local_200;
            uVar10 = local_234;
            if (local_260 != 0) {
              bVar8 = false;
              goto LAB_001047a5;
            }
          }
          uVar10 = uVar10 + 1;
          bVar8 = true;
        }
LAB_001047a5:
        if (!bVar8) {
          uVar10 = (uint)((local_260 & local_238) == 0);
          lVar14 = (long)(int)uVar10 + -1;
          auVar17._8_4_ = (int)lVar14;
          auVar17._0_8_ = lVar14;
          auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
          local_228 = local_228 & auVar17;
          auVar17 = auVar17 & local_218;
          lVar14 = (long)(int)uVar10 + -1;
          auVar18._8_4_ = (int)lVar14;
          auVar18._0_8_ = lVar14;
          auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
          local_258 = local_258 & auVar18;
          auVar18 = auVar18 & local_248;
          local_218._0_8_ = auVar17._0_8_;
          local_218._8_8_ = auVar17._8_8_;
          *(undefined8 *)(local_208->data + 0x10) = local_218._0_8_;
          *(undefined8 *)(local_208->data + 0x18) = local_218._8_8_;
          *(undefined8 *)local_208->data = local_228._0_8_;
          *(undefined8 *)(local_208->data + 8) = local_228._8_8_;
          local_248._0_8_ = auVar18._0_8_;
          local_248._8_8_ = auVar18._8_8_;
          *(undefined8 *)(local_208->data + 0x20) = local_258._0_8_;
          *(undefined8 *)(local_208->data + 0x28) = local_258._8_8_;
          *(undefined8 *)(local_208->data + 0x30) = local_248._0_8_;
          *(undefined8 *)(local_208->data + 0x38) = local_248._8_8_;
          return local_260 & local_238;
        }
      } while( true );
    }
    secp256k1_ecdsa_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}